

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iraffits.c
# Opt level: O0

char * irafgetc(char *irafheader,int offset,int nc)

{
  int in_EDX;
  int in_ESI;
  long in_RDI;
  int i;
  char *cheader;
  char *ctemp;
  int local_2c;
  char *local_8;
  
  local_8 = (char *)calloc((long)(in_EDX + 1),1);
  if (local_8 == (char *)0x0) {
    ffpmsg((char *)0x2146f8);
    local_8 = (char *)0x0;
  }
  else {
    for (local_2c = 0; local_2c < in_EDX; local_2c = local_2c + 1) {
      local_8[local_2c] = *(char *)(in_RDI + (in_ESI + local_2c));
      if (('\0' < local_8[local_2c]) && (local_8[local_2c] < ' ')) {
        local_8[local_2c] = ' ';
      }
    }
  }
  return local_8;
}

Assistant:

static char *irafgetc (

char	*irafheader,	/* IRAF image header */
int	offset,		/* Number of bytes to skip before string */
int	nc)		/* Maximum number of characters in string */

{
    char *ctemp, *cheader;
    int i;

    cheader = irafheader;
    ctemp = (char *) calloc (nc+1, 1);
    if (ctemp == NULL) {
	ffpmsg("IRAFGETC Cannot allocate memory for string variable");
	return (NULL);
	}
    for (i = 0; i < nc; i++) {
	ctemp[i] = cheader[offset+i];
	if (ctemp[i] > 0 && ctemp[i] < 32)
	    ctemp[i] = ' ';
	}

    return (ctemp);
}